

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrule.cpp
# Opt level: O3

DateTimeRule * __thiscall icu_63::DateTimeRule::operator=(DateTimeRule *this,DateTimeRule *right)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  DateRuleType DVar4;
  
  if (this != right) {
    iVar1 = right->fDayOfMonth;
    iVar2 = right->fDayOfWeek;
    iVar3 = right->fWeekInMonth;
    this->fMonth = right->fMonth;
    this->fDayOfMonth = iVar1;
    this->fDayOfWeek = iVar2;
    this->fWeekInMonth = iVar3;
    DVar4 = right->fDateRuleType;
    this->fMillisInDay = right->fMillisInDay;
    this->fDateRuleType = DVar4;
    this->fTimeRuleType = right->fTimeRuleType;
  }
  return this;
}

Assistant:

DateTimeRule&
DateTimeRule::operator=(const DateTimeRule& right) {
    if (this != &right) {
        fMonth = right.fMonth;
        fDayOfMonth = right.fDayOfMonth;
        fDayOfWeek = right.fDayOfWeek;
        fWeekInMonth = right.fWeekInMonth;
        fMillisInDay = right.fMillisInDay;
        fDateRuleType = right.fDateRuleType;
        fTimeRuleType = right.fTimeRuleType;
    }
    return *this;
}